

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib555.c
# Opt level: O0

curlioerr ioctlcallback(CURL *handle,int cmd,void *clientp)

{
  int *counter;
  void *clientp_local;
  int cmd_local;
  CURL *handle_local;
  
  if (cmd == 1) {
    curl_mfprintf(_stderr,"REWIND!\n");
    *(undefined4 *)clientp = 0;
  }
  return CURLIOE_OK;
}

Assistant:

static curlioerr ioctlcallback(CURL *handle,
                               int cmd,
                               void *clientp)
{
  int *counter = (int *)clientp;
  (void)handle; /* unused */
  if(cmd == CURLIOCMD_RESTARTREAD) {
    fprintf(stderr, "REWIND!\n");
    *counter = 0; /* clear counter to make the read callback restart */
  }
  return CURLIOE_OK;
}